

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BrokerBase.cpp
# Opt level: O0

int __thiscall helics::BrokerBase::parseArgs(BrokerBase *this,int argc,char **argv)

{
  ParseOutput PVar1;
  long *in_RDI;
  shared_ptr<helics::helicsCLI11App> sVar2;
  App_p *in_stack_00000018;
  App *in_stack_00000020;
  ParseOutput res;
  char ***in_stack_00000040;
  int *in_stack_00000048;
  shared_ptr<helics::helicsCLI11App> sApp;
  shared_ptr<helics::helicsCLI11App> app;
  BrokerBase *in_stack_00001158;
  shared_ptr<helics::helicsCLI11App> *in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  undefined1 local_38 [56];
  
  sVar2 = generateBaseCLI(in_stack_00001158);
  (**(code **)(*in_RDI + 0x40))
            (local_38,in_RDI,
             sVar2.super___shared_ptr<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi._M_pi);
  CLI::std::__shared_ptr_access<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)0x52e5fe);
  std::shared_ptr<CLI::App>::shared_ptr<helics::helicsCLI11App,void>
            ((shared_ptr<CLI::App> *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
             in_stack_ffffffffffffff78);
  CLI::App::add_subcommand(in_stack_00000020,in_stack_00000018);
  CLI::std::shared_ptr<CLI::App>::~shared_ptr((shared_ptr<CLI::App> *)0x52e632);
  CLI::std::__shared_ptr_access<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)0x52e63c);
  PVar1 = helicsCLI11App::helics_parse<int&,char**&>
                    (sApp.super___shared_ptr<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr,in_stack_00000048,in_stack_00000040);
  CLI::std::shared_ptr<helics::helicsCLI11App>::~shared_ptr
            ((shared_ptr<helics::helicsCLI11App> *)0x52e664);
  CLI::std::shared_ptr<helics::helicsCLI11App>::~shared_ptr
            ((shared_ptr<helics::helicsCLI11App> *)0x52e66e);
  return PVar1;
}

Assistant:

int BrokerBase::parseArgs(int argc, char* argv[])
{
    auto app = generateBaseCLI();
    auto sApp = generateCLI();
    app->add_subcommand(sApp);
    auto res = app->helics_parse(argc, argv);
    return static_cast<int>(res);
}